

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::JsonReporter::listTests
          (JsonReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  TestCaseInfo *pTVar2;
  size_type __n;
  undefined8 in_RSI;
  JsonArrayWriter *in_RDI;
  Tag *tag;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *__range3;
  JsonArrayWriter tag_writer;
  TestCaseInfo *info;
  JsonObjectWriter desc_writer;
  TestCaseHandle *test;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range1;
  JsonArrayWriter writer;
  JsonValueWriter *in_stack_fffffffffffff878;
  JsonReporter *in_stack_fffffffffffff890;
  JsonValueWriter *this_00;
  __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
  local_758;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *local_750;
  StringRef local_748;
  JsonObjectWriter local_738 [18];
  char *local_588;
  void *pvStack_580;
  StringRef local_570;
  JsonValueWriter local_560;
  StringRef local_3c8;
  JsonObjectWriter local_3b8 [14];
  SourceLineInfo *in_stack_fffffffffffffda8;
  JsonObjectWriter *in_stack_fffffffffffffdb0;
  undefined1 local_218 [24];
  TestCaseHandle *local_200;
  TestCaseHandle *local_1f8;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  local_1f0;
  undefined8 local_1e8;
  StringRef local_1d0;
  JsonValueWriter local_1c0;
  undefined8 local_10;
  
  local_10 = in_RSI;
  startListing(in_stack_fffffffffffff890);
  value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
          ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                 *)0x1a57fa);
  local_1d0 = operator____sr((char *)in_RDI,(size_t)in_stack_fffffffffffff878);
  this_00 = &local_1c0;
  JsonObjectWriter::write((JsonObjectWriter *)this_00,(int)value,local_1d0.m_start,local_1d0.m_size)
  ;
  JsonValueWriter::writeArray(in_stack_fffffffffffff878);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a5868);
  local_1e8 = local_10;
  local_1f0._M_current =
       (TestCaseHandle *)
       std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                 ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                  in_stack_fffffffffffff878);
  local_1f8 = (TestCaseHandle *)
              std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end
                        ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                         in_stack_fffffffffffff878);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                        *)in_stack_fffffffffffff878);
    if (!bVar1) break;
    local_200 = __gnu_cxx::
                __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                ::operator*(&local_1f0);
    JsonArrayWriter::writeObject((JsonArrayWriter *)value);
    pTVar2 = TestCaseHandle::getTestCaseInfo(local_200);
    local_3c8 = operator____sr((char *)in_RDI,(size_t)in_stack_fffffffffffff878);
    JsonObjectWriter::write(local_3b8,(int)local_218,local_3c8.m_start,local_3c8.m_size);
    JsonValueWriter::write<std::__cxx11::string>(this_00,value);
    JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a596d);
    local_570 = operator____sr((char *)in_RDI,(size_t)in_stack_fffffffffffff878);
    __n = local_570.m_size;
    JsonObjectWriter::write
              ((JsonObjectWriter *)&local_560,(int)local_218,local_570.m_start,local_570.m_size);
    local_588 = (pTVar2->className).m_start;
    pvStack_580 = (void *)(pTVar2->className).m_size;
    JsonValueWriter::write(&local_560,(int)local_588,pvStack_580,__n);
    JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a59f5);
    local_748 = operator____sr((char *)in_RDI,(size_t)in_stack_fffffffffffff878);
    JsonObjectWriter::write(local_738,(int)local_218,local_748.m_start,local_748.m_size);
    JsonValueWriter::writeArray(in_stack_fffffffffffff878);
    JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a5a4c);
    local_750 = &pTVar2->tags;
    local_758._M_current =
         (Tag *)std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::begin
                          ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)
                           in_stack_fffffffffffff878);
    std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::end
              ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)in_stack_fffffffffffff878);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                          *)in_RDI,
                         (__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                          *)in_stack_fffffffffffff878);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>::
      operator*(&local_758);
      JsonArrayWriter::write<Catch::StringRef>(in_RDI,(StringRef *)in_stack_fffffffffffff878);
      __gnu_cxx::
      __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>::
      operator++(&local_758);
    }
    JsonArrayWriter::~JsonArrayWriter(in_RDI);
    anon_unknown_26::writeSourceInfo(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    JsonObjectWriter::~JsonObjectWriter((JsonObjectWriter *)in_RDI);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
    ::operator++(&local_1f0);
  }
  JsonArrayWriter::~JsonArrayWriter(in_RDI);
  return;
}

Assistant:

void JsonReporter::listTests( std::vector<TestCaseHandle> const& tests ) {
        startListing();

        auto writer = m_objectWriters.top().write( "tests"_sr ).writeArray();

        for ( auto const& test : tests ) {
            auto desc_writer = writer.writeObject();
            auto const& info = test.getTestCaseInfo();

            desc_writer.write( "name"_sr ).write( info.name );
            desc_writer.write( "class-name"_sr ).write( info.className );
            {
                auto tag_writer = desc_writer.write( "tags"_sr ).writeArray();
                for ( auto const& tag : info.tags ) {
                    tag_writer.write( tag.original );
                }
            }
            writeSourceInfo( desc_writer, info.lineInfo );
        }
    }